

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O2

vec4 ImageCodec::decodeFLOAT_UINTVec<unsigned_char,3>(ImageCodec *param_1,void *ptr)

{
  byte bVar1;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 aVar2;
  float *pfVar3;
  int i;
  long lVar4;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_28;
  
  local_28._0_8_ = 0;
  local_28._8_8_ = 0x3f80000000000000;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    bVar1 = *(byte *)((long)ptr + lVar4);
    pfVar3 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       ((vec<4,_float,_(glm::precision)0> *)&local_28.field_0,(length_type)lVar4);
    *pfVar3 = (float)bVar1 / 511.0;
  }
  aVar2._8_8_ = local_28._8_8_;
  aVar2._0_8_ = local_28._0_8_;
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)aVar2.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_UINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        const auto upper = static_cast<float>((256u << sizeof(TYPE)) - 1u);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = static_cast<float>(data[i]) / upper;
        return result;
    }